

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

void __thiscall ncnn::Interp::Interp(Interp *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Interp_005ad240;
  (this->size_expr)._M_dataplus._M_p = (pointer)&(this->size_expr).field_2;
  (this->size_expr)._M_string_length = 0;
  (this->size_expr).field_2._M_local_buf[0] = '\0';
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = false;
  return;
}

Assistant:

Interp::Interp()
{
    one_blob_only = true;
    support_inplace = false;
}